

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *
vkt::tessellation::generateReferenceQuadTessCoords
          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *__return_storage_ptr__,SpacingMode spacingMode,int inner0,int inner1,int outer0,
          int outer1,int outer2,int outer3)

{
  uint inner1_00;
  float fVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  Vector<float,_3> local_78;
  float local_6c;
  pointer local_68;
  pointer pVStack_60;
  pointer local_58;
  ulong local_48;
  int local_3c;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_38;
  
  local_68 = (pointer)0x0;
  pVStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  if (inner1 == 1 || inner0 == 1) {
    if ((((inner0 != 1) || (inner1 != 1)) || (outer0 != 1)) ||
       (((outer1 != 1 || (outer2 != 1)) || (outer3 != 1)))) {
      inner1_00 = spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2;
      if (inner0 < 2) {
        inner0 = inner1_00;
      }
      if (1 < inner1) {
        inner1_00 = inner1;
      }
      generateReferenceQuadTessCoords
                (__return_storage_ptr__,spacingMode,inner0,inner1_00,outer0,outer1,outer2,outer3);
      goto LAB_007b3a74;
    }
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 0.0;
    local_78.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
               &local_78);
    local_78.m_data[0] = 1.0;
    local_78.m_data[1] = 0.0;
    local_78.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
               &local_78);
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 1.0;
    local_78.m_data[2] = 0.0;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
               &local_78);
    local_78.m_data[0] = 1.0;
    local_78.m_data[1] = 1.0;
    local_78.m_data[2] = 0.0;
    local_38 = __return_storage_ptr__;
    std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
    emplace_back<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
               &local_78);
  }
  else {
    local_6c = (float)outer1;
    local_48 = (ulong)(uint)inner1;
    local_38 = __return_storage_ptr__;
    if (0 < outer0) {
      iVar3 = 0;
      do {
        local_78.m_data[1] = (float)iVar3 / (float)outer0;
        local_78.m_data[0] = 0.0;
        local_78.m_data[2] = 0.0;
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
                   &local_78);
        iVar3 = iVar3 + 1;
      } while (outer0 != iVar3);
    }
    fVar5 = local_6c;
    if (0 < (int)local_6c) {
      fVar4 = (float)(int)local_6c;
      fVar1 = 0.0;
      do {
        local_78.m_data[0] = 1.0 - (float)(int)fVar1 / fVar4;
        local_78.m_data[1] = 0.0;
        local_78.m_data[2] = 0.0;
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
                   &local_78);
        fVar1 = (float)((int)fVar1 + 1);
      } while (fVar5 != fVar1);
    }
    if (0 < outer2) {
      iVar3 = 0;
      do {
        local_78.m_data[1] = 1.0 - (float)iVar3 / (float)outer2;
        local_78.m_data[0] = 1.0;
        local_78.m_data[2] = 0.0;
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
                   &local_78);
        iVar3 = iVar3 + 1;
      } while (outer2 != iVar3);
    }
    if (0 < outer3) {
      iVar3 = 0;
      do {
        local_78.m_data[0] = (float)iVar3 / (float)outer3;
        local_78.m_data[1] = 1.0;
        local_78.m_data[2] = 0.0;
        std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
        emplace_back<tcu::Vector<float,3>>
                  ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)&local_68,
                   &local_78);
        iVar3 = iVar3 + 1;
      } while (outer3 != iVar3);
    }
    local_3c = (int)local_48 + -1;
    if (0 < local_3c) {
      local_6c = (float)inner0;
      local_48 = CONCAT44(local_48._4_4_,(float)(int)local_48);
      iVar3 = 0;
      do {
        if (0 < inner0 + -1) {
          fVar5 = (float)(iVar3 + 1) / (float)local_48;
          iVar2 = 1;
          do {
            local_78.m_data[0] = (float)iVar2 / local_6c;
            local_78.m_data[2] = 0.0;
            local_78.m_data[1] = fVar5;
            std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>::
            emplace_back<tcu::Vector<float,3>>
                      ((vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>> *)
                       &local_68,&local_78);
            iVar2 = iVar2 + 1;
          } while (inner0 != iVar2);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != local_3c);
    }
  }
  (local_38->super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
  _M_impl.super__Vector_impl_data._M_start = local_68;
  (local_38->super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = pVStack_60;
  (local_38->super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
  local_68 = (pointer)0x0;
  pVStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  __return_storage_ptr__ = local_38;
LAB_007b3a74:
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::Vec3> generateReferenceQuadTessCoords (const SpacingMode	spacingMode,
														const int			inner0,
														const int			inner1,
														const int			outer0,
														const int			outer1,
														const int			outer2,
														const int			outer3)
{
	std::vector<tcu::Vec3> tessCoords;

	if (inner0 == 1 || inner1 == 1)
	{
		if (inner0 == 1 && inner1 == 1 && outer0 == 1 && outer1 == 1 && outer2 == 1 && outer3 == 1)
		{
			tessCoords.push_back(tcu::Vec3(0.0f, 0.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(1.0f, 0.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(0.0f, 1.0f, 0.0f));
			tessCoords.push_back(tcu::Vec3(1.0f, 1.0f, 0.0f));
			return tessCoords;
		}
		else
			return generateReferenceQuadTessCoords(spacingMode, inner0 > 1 ? inner0 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																inner1 > 1 ? inner1 : spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																outer0, outer1, outer2, outer3);
	}
	else
	{
		for (int i = 0; i < outer0; i++) { const float v = (float)i / (float)outer0; tessCoords.push_back(tcu::Vec3(    0.0f,        v, 0.0f)); }
		for (int i = 0; i < outer1; i++) { const float v = (float)i / (float)outer1; tessCoords.push_back(tcu::Vec3(1.0f - v,     0.0f, 0.0f)); }
		for (int i = 0; i < outer2; i++) { const float v = (float)i / (float)outer2; tessCoords.push_back(tcu::Vec3(    1.0f, 1.0f - v, 0.0f)); }
		for (int i = 0; i < outer3; i++) { const float v = (float)i / (float)outer3; tessCoords.push_back(tcu::Vec3(       v,     1.0f, 0.0f)); }

		for (int innerVtxY = 0; innerVtxY < inner1-1; innerVtxY++)
		for (int innerVtxX = 0; innerVtxX < inner0-1; innerVtxX++)
			tessCoords.push_back(tcu::Vec3((float)(innerVtxX + 1) / (float)inner0,
										   (float)(innerVtxY + 1) / (float)inner1,
										   0.0f));

		return tessCoords;
	}
}